

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O2

uint64_t t1ha_32be(void *data,size_t len,uint64_t seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  
  uVar8 = (uint)len;
  uVar1 = (uVar8 << 0xf | uVar8 >> 0x11) + (int)seed;
  uVar5 = (uint)(seed >> 0x20) ^ uVar8;
  if (0x10 < len) {
    uVar9 = ~uVar1;
    uVar2 = uVar5 << 0x1b | uVar5 >> 5;
    puVar12 = (uint *)((long)data + (len - 0xf));
    do {
      uVar13 = *data;
      uVar6 = *(uint *)((long)data + 4);
      uVar3 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar10 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar13 = *(uint *)((long)data + 8);
      uVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar13 = *(uint *)((long)data + 0xc);
      uVar7 = uVar6 + uVar9;
      uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar14 = uVar13 + uVar2;
      uVar5 = uVar10 + uVar5;
      uVar1 = uVar3 + uVar1;
      uVar9 = (uVar5 * 0x2000000 | uVar5 >> 7) ^ uVar9;
      uVar2 = (uVar1 * 0x20000000 | uVar1 >> 3) ^ uVar2;
      uVar5 = (((uVar7 * 0x200000 | uVar7 >> 0xb) ^ uVar3) + uVar13) * -0x3564b8cb;
      uVar1 = ((uVar14 * 0x8000 | uVar14 >> 0x11) + uVar10 ^ uVar6) * -0x6d287d97;
      data = (void *)((long)data + 0x10);
    } while (data < puVar12);
    uVar9 = uVar9 + uVar1;
    uVar2 = uVar2 + uVar5;
    uVar1 = uVar1 ^ ((uVar9 * 0x10000 | uVar9 >> 0x10) + uVar2) * -0x3b44ca8b;
    uVar5 = ((uVar2 * 0x10000 | uVar2 >> 0x10) + uVar9) * -0x35d25905 ^ uVar5;
    len = (size_t)(uVar8 & 0xf);
  }
  switch(len) {
  default:
    uVar8 = *data;
    lVar11 = (ulong)((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) + uVar5) * 0x86f0fd61;
    uVar1 = uVar1 ^ (uint)lVar11;
    uVar5 = (int)((ulong)lVar11 >> 0x20) + uVar5;
    data = (void *)((long)data + 4);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    uVar8 = *data;
    lVar11 = (ulong)((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) + uVar1) * 0xf6499843;
    uVar5 = uVar5 ^ (uint)lVar11;
    uVar1 = (int)((ulong)lVar11 >> 0x20) + uVar1;
    data = (void *)((long)data + 4);
  case 5:
  case 6:
  case 7:
  case 8:
    uVar8 = *data;
    lVar11 = (ulong)((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                     uVar8 << 0x18) + uVar5) * 0xa4aba1c3;
    uVar1 = uVar1 ^ (uint)lVar11;
    uVar5 = (int)((ulong)lVar11 >> 0x20) + uVar5;
    data = (void *)((long)data + 4);
  case 1:
  case 2:
  case 3:
  case 4:
    switch((uint)len & 3) {
    case 0:
      uVar8 = *data;
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      break;
    case 1:
      uVar8 = (uint)(byte)*data;
      break;
    case 2:
      uVar8 = (uint)(ushort)((ushort)*data << 8 | (ushort)*data >> 8);
      break;
    case 3:
      uVar8 = (uint)CONCAT12((byte)*data,
                             *(ushort *)((long)data + 1) << 8 | *(ushort *)((long)data + 1) >> 8);
    }
    lVar11 = (ulong)(uVar8 + uVar1) * 0xca9b4735;
    uVar5 = uVar5 ^ (uint)lVar11;
    uVar1 = (int)((ulong)lVar11 >> 0x20) + uVar1;
  case 0:
    uVar4 = CONCAT44(uVar5,(uVar5 << 0x13 | uVar5 >> 0xd) ^ uVar1) * -0x136640f27c8d3555;
    return uVar4 >> 0x29 ^ uVar4;
  }
}

Assistant:

uint64_t t1ha_32be(const void *data, size_t len, uint64_t seed) {
  uint32_t a = rot32((uint32_t)len, s1) + (uint32_t)seed;
  uint32_t b = (uint32_t)len ^ (uint32_t)(seed >> 32);

  const int need_align = (((uintptr_t)data) & 3) != 0 && !UNALIGNED_OK;
  uint32_t align[4];

  if (unlikely(len > 16)) {
    uint32_t c = ~a;
    uint32_t d = rot32(b, 5);
    const void *detent = (const uint8_t *)data + len - 15;
    do {
      const uint32_t *v = (const uint32_t *)data;
      if (unlikely(need_align))
        v = (const uint32_t *)memcpy(&align, v, 16);

      uint32_t w0 = fetch32_be(v + 0);
      uint32_t w1 = fetch32_be(v + 1);
      uint32_t w2 = fetch32_be(v + 2);
      uint32_t w3 = fetch32_be(v + 3);

      uint32_t c02 = w0 ^ rot32(w2 + c, 11);
      uint32_t d13 = w1 + rot32(w3 + d, s1);
      c ^= rot32(b + w1, 7);
      d ^= rot32(a + w0, 3);
      b = q1 * (c02 + w3);
      a = q0 * (d13 ^ w2);

      data = (const uint32_t *)data + 4;
    } while (likely(data < detent));

    c += a;
    d += b;
    a ^= q6 * (rot32(c, 16) + d);
    b ^= q5 * (c + rot32(d, 16));

    len &= 15;
  }

  const uint8_t *v = (const uint8_t *)data;
  if (unlikely(need_align) && len > 4)
    v = (const uint8_t *)memcpy(&align, v, len);

  switch (len) {
  default:
    mixup32(&a, &b, fetch32_be(v), q4);
    v += 4;
  case 12:
  case 11:
  case 10:
  case 9:
    mixup32(&b, &a, fetch32_be(v), q3);
    v += 4;
  case 8:
  case 7:
  case 6:
  case 5:
    mixup32(&a, &b, fetch32_be(v), q2);
    v += 4;
  case 4:
  case 3:
  case 2:
  case 1:
    mixup32(&b, &a, tail32_be(v, len), q1);
  case 0:
    return remix32(a, b);
  }
}